

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

QAnimationTimer * QAnimationTimer::instance(bool create)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  QAnimationTimer *this;
  
  lVar3 = __tls_get_addr(&PTR_00674338);
  if (*(char *)(lVar3 + 0x80) == '\0') {
    __cxa_thread_atexit(std::unique_ptr<QAnimationTimer,_std::default_delete<QAnimationTimer>_>::
                        ~unique_ptr,lVar3 + 0x78,&__dso_handle);
    *(undefined1 *)(lVar3 + 0x80) = 1;
  }
  plVar1 = (long *)(lVar3 + 0x78);
  if ((create) && (*(long *)(lVar3 + 0x78) == 0)) {
    this = (QAnimationTimer *)operator_new(0x78);
    QAnimationTimer((QAnimationTimer *)this);
    plVar2 = (long *)*plVar1;
    *plVar1 = (long)this;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x20))();
    }
  }
  else {
    this = (QAnimationTimer *)*plVar1;
  }
  return this;
}

Assistant:

QAnimationTimer *QAnimationTimer::instance(bool create)
{
    QAnimationTimer *inst;
#if QT_CONFIG(thread)
    static thread_local std::unique_ptr<QAnimationTimer> animationTimer;
    if (create && !animationTimer) {
        inst = new QAnimationTimer;
        animationTimer.reset(inst);
    } else {
        inst = animationTimer.get();
    }
#else
    Q_UNUSED(create);
    static QAnimationTimer animationTimer;
    inst = &animationTimer;
#endif
    return inst;
}